

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3a3c35::Handlers::beginArray
          (Handlers *this,json_handler_t *start_fn,bare_handler_t *end_fn)

{
  JSONHandler *pJVar1;
  shared_ptr<JSONHandler> item_jh;
  _Any_data local_c8;
  code *local_b8;
  code *pcStack_b0;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2> local_70;
  _Any_data local_60;
  long local_50;
  undefined8 uStack_48;
  _Any_data local_40;
  long local_30;
  undefined8 uStack_28;
  
  std::make_shared<JSONHandler>();
  pJVar1 = this->jh;
  std::function<void_(JSON)>::function((function<void_(JSON)> *)&local_40,start_fn);
  local_b8 = (code *)0x0;
  pcStack_b0 = (code *)0x0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  local_c8._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_c8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_c8._M_unused._0_8_ + 0x18) = uStack_28;
  if (local_30 != 0) {
    *(void **)local_c8._M_unused._0_8_ = local_40._M_unused._M_object;
    *(undefined8 *)((long)local_c8._M_unused._0_8_ + 8) = local_40._8_8_;
    *(long *)((long)local_c8._M_unused._0_8_ + 0x10) = local_30;
    local_30 = 0;
    uStack_28 = 0;
  }
  pcStack_b0 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:204:9)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:204:9)>
             ::_M_manager;
  std::function<void_()>::function((function<void_()> *)&local_60,end_fn);
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_a8._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_a8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x18) = uStack_48;
  if (local_50 != 0) {
    *(void **)local_a8._M_unused._0_8_ = local_60._M_unused._M_object;
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = local_60._8_8_;
    *(long *)((long)local_a8._M_unused._0_8_ + 0x10) = local_50;
    local_50 = 0;
    uStack_48 = 0;
  }
  pcStack_90 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:205:9)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:205:9)>
             ::_M_manager;
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_70,&item_jh.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>);
  JSONHandler::addArrayHandlers
            (pJVar1,(json_handler_t *)&local_c8,(void_handler_t *)&local_a8,
             (shared_ptr<JSONHandler> *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
  std::_Function_base::~_Function_base((_Function_base *)&local_a8);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  pJVar1 = this->jh;
  std::__shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_80,&item_jh.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>);
  JSONHandler::addFallbackHandler(pJVar1,(shared_ptr<JSONHandler> *)&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  this->jh = item_jh.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>>::
  emplace_back<std::shared_ptr<JSONHandler>>
            ((vector<std::shared_ptr<JSONHandler>,std::allocator<std::shared_ptr<JSONHandler>>> *)
             this,&item_jh);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&item_jh.super___shared_ptr<JSONHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void
Handlers::beginArray(json_handler_t start_fn, bare_handler_t end_fn)
{
    auto item_jh = std::make_shared<JSONHandler>();
    jh->addArrayHandlers(
        [start_fn](std::string const&, JSON j) { start_fn(j); },
        [end_fn](std::string const&) { end_fn(); },
        item_jh);
    jh->addFallbackHandler(item_jh);
    this->jh = item_jh.get();
    this->json_handlers.emplace_back(std::move(item_jh));
}